

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

AggregateFunction *
duckdb::ListContinuousQuantile::GetFunction<short,short>
          (LogicalType *input_type,LogicalType *target_type)

{
  AggregateFunction *in_RDI;
  AggregateFunction *fun;
  LogicalType *in_stack_000000e0;
  LogicalType *in_stack_000000e8;
  AggregateFunction *pAVar1;
  
  pAVar1 = in_RDI;
  QuantileListAggregate<duckdb::QuantileState<short,duckdb::QuantileStandardType>,short,duckdb::list_entry_t,duckdb::QuantileListOperation<short,false>>
            (in_stack_000000e8,in_stack_000000e0);
  in_RDI->order_dependent = NOT_ORDER_DEPENDENT;
  in_RDI->window =
       QuantileListOperation<short,false>::
       Window<duckdb::QuantileState<short,duckdb::QuantileStandardType>,short,duckdb::list_entry_t>;
  in_RDI->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<short,duckdb::QuantileStandardType>,short>;
  return pAVar1;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &input_type, const LogicalType &target_type) {
		using STATE = QuantileState<INPUT_TYPE, QuantileStandardType>;
		using OP = QuantileListOperation<TARGET_TYPE, false>;
		auto fun = QuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(input_type, target_type);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::template Window<STATE, INPUT_TYPE, list_entry_t>;
		fun.window_init = OP::template WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}